

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFlow.c
# Opt level: O1

int Nwk_ManVerifyCut_rec(Nwk_Obj_t *pObj)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  uVar1 = *(uint *)&pObj->field_0x20;
  iVar3 = 1;
  if ((uVar1 & 0x10) == 0) {
    iVar2 = pObj->pMan->nTruePis;
    if ((((int)(uVar1 >> 7) < iVar2) || ((uVar1 & 7) != 1)) || (iVar2 == 0)) {
      iVar2 = pObj->pMan->nTravIds;
      if ((pObj->TravId != iVar2) && (pObj->TravId = iVar2, 0 < pObj->nFanins)) {
        lVar4 = 0;
        do {
          if (pObj->pFanio[lVar4] == (Nwk_Obj_t *)0x0) {
            return 1;
          }
          iVar2 = Nwk_ManVerifyCut_rec(pObj->pFanio[lVar4]);
          if (iVar2 == 0) goto LAB_008ddb12;
          lVar4 = lVar4 + 1;
        } while (lVar4 < pObj->nFanins);
      }
    }
    else {
LAB_008ddb12:
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int Nwk_ManVerifyCut_rec( Nwk_Obj_t * pObj )
{
    Nwk_Obj_t * pNext;
    int i;
    if ( pObj->MarkA )
        return 1;
    if ( Nwk_ObjIsLo(pObj) )
        return 0;
    if ( Nwk_ObjIsTravIdCurrent( pObj ) )
        return 1;
    Nwk_ObjSetTravIdCurrent( pObj );
    Nwk_ObjForEachFanin( pObj, pNext, i )
        if ( !Nwk_ManVerifyCut_rec( pNext ) )
            return 0;
    return 1;
}